

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint64_t aesnihash(uint8_t *in,unsigned_long src_sz)

{
  unsigned_long i;
  ulong uVar1;
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint8_t tmp_buf [16];
  
  tmp_buf[0] = '\0';
  tmp_buf[1] = '\0';
  tmp_buf[2] = '\0';
  tmp_buf[3] = '\0';
  tmp_buf[4] = '\0';
  tmp_buf[5] = '\0';
  tmp_buf[6] = '\0';
  tmp_buf[7] = '\0';
  tmp_buf[8] = '\0';
  tmp_buf[9] = '\0';
  tmp_buf[10] = '\0';
  tmp_buf[0xb] = '\0';
  tmp_buf[0xc] = '\0';
  tmp_buf[0xd] = '\0';
  tmp_buf[0xe] = '\0';
  tmp_buf[0xf] = '\0';
  auVar4 = _DAT_00194fe0;
  do {
    pauVar2 = (undefined1 (*) [16])in;
    if (src_sz < 0x10) {
      if (src_sz == 0) {
        auVar3 = aesenc(auVar4,(undefined1  [16])0x0);
        auVar4 = vpshufd_avx(auVar3,0xee);
        return auVar3._0_8_ ^ auVar4._0_8_;
      }
      for (uVar1 = 0; src_sz != uVar1; uVar1 = uVar1 + 1) {
        tmp_buf[uVar1] = (*(undefined1 (*) [16])in)[uVar1];
      }
      src_sz = 0x10;
      pauVar2 = (undefined1 (*) [16])tmp_buf;
    }
    src_sz = src_sz - 0x10;
    in = (uint8_t *)(pauVar2 + 1);
    auVar4 = aesenc(auVar4 ^ *pauVar2,_DAT_00194fe0);
    auVar4 = aesenc(auVar4,_DAT_00194ff0);
  } while( true );
}

Assistant:

uint64_t aesnihash(uint8_t *in, unsigned long src_sz) {
  uint8_t tmp_buf[16] = {0};
  __m128i rk0 = {0x736f6d6570736575ULL, 0x646f72616e646f6dULL};
  __m128i rk1 = {0x1231236570743245ULL, 0x126f12321321456dULL};
  __m128i hash = rk0;

  while (src_sz >= 16) {
  onemoretry:
    __m128i piece = _mm_loadu_si128((__m128i *)in);
    in += 16;
    src_sz -= 16;
    hash = _mm_aesenc_si128(_mm_xor_si128(hash, piece), rk0);
    hash = _mm_aesenc_si128(hash, rk1);
  }

  if (src_sz > 0) {
    unsigned long i;
    for (i = 0; i < src_sz && i < 16; i++) {
      tmp_buf[i] = in[i];
    }
    src_sz = 16;
    in = &tmp_buf[0];
    goto onemoretry;
  }

  hash = _mm_aesenc_si128(hash, _mm_set_epi64x(src_sz, src_sz));

  return hash[0] ^ hash[1];
}